

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_mesh_tasks(CompilerHLSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  CompilerError *this_00;
  uint32_t id;
  undefined1 local_a8 [32];
  undefined1 local_88 [48];
  undefined1 local_58 [32];
  SPIRBlock *local_18;
  SPIRBlock *block_local;
  CompilerHLSL *this_local;
  
  local_18 = block;
  block_local = (SPIRBlock *)this;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->mesh).payload);
  if (uVar1 != 0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_18->mesh);
    id = (uint32_t)this;
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              ((CompilerGLSL *)&stack0xffffffffffffffc8,id,SUB41(uVar1,0));
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 1));
    CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_58,id,SUB41(uVar1,0));
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 2));
    CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_88,id,SUB41(uVar1,0));
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->mesh).payload);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_a8,id,SUB41(uVar1,0));
    CompilerGLSL::
    statement<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [14])"DispatchMesh(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc8,(char (*) [3])0x421228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (char (*) [3])0x421228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [3])0x421228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (char (*) [3])0x40acad);
    ::std::__cxx11::string::~string((string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_88);
    ::std::__cxx11::string::~string((string *)local_58);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Amplification shader in HLSL must have payload");
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerHLSL::emit_mesh_tasks(SPIRBlock &block)
{
	if (block.mesh.payload != 0)
	{
		statement("DispatchMesh(", to_unpacked_expression(block.mesh.groups[0]), ", ", to_unpacked_expression(block.mesh.groups[1]), ", ",
		    to_unpacked_expression(block.mesh.groups[2]), ", ", to_unpacked_expression(block.mesh.payload), ");");
	}
	else
	{
		SPIRV_CROSS_THROW("Amplification shader in HLSL must have payload");
	}
}